

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTupleMake
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,uint32_t arity)

{
  Type *operands;
  TupleMake *expr;
  undefined1 local_a0 [8];
  TupleMake curr;
  undefined1 local_50 [8];
  Result<wasm::Ok> _val;
  
  if (arity < 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"tuple arity must be at least 2",(allocator<char> *)local_50);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_a0);
    std::__cxx11::string::~string((string *)local_a0);
  }
  else {
    curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = (size_t)&this->wasm->allocator;
    operands = &curr.super_SpecificExpression<(wasm::Expression::Id)57>.super_Expression.type;
    local_a0[0] = (string)0x39;
    curr.super_SpecificExpression<(wasm::Expression::Id)57>.super_Expression._id = InvalidId;
    curr.super_SpecificExpression<(wasm::Expression::Id)57>.super_Expression._1_7_ = 0;
    curr.super_SpecificExpression<(wasm::Expression::Id)57>.super_Expression.type.id = 0;
    curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
         (Expression **)0x0;
    curr.operands.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)operands,
               (ulong)arity);
    visitExpression((Result<wasm::Ok> *)local_50,this,(Expression *)local_a0);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string((string *)&curr.operands.allocator,(string *)local_50);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 &curr.operands.allocator);
      std::__cxx11::string::~string((string *)&curr.operands.allocator);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_50);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_50);
      expr = Builder::makeTupleMake<ArenaVector<wasm::Expression*>&>
                       (&this->builder,(ArenaVector<wasm::Expression_*> *)operands);
      push(this,(Expression *)expr);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTupleMake(uint32_t arity) {
  if (arity < 2) {
    return Err{"tuple arity must be at least 2"};
  }
  TupleMake curr(wasm.allocator);
  curr.operands.resize(arity);
  CHECK_ERR(visitTupleMake(&curr));
  push(builder.makeTupleMake(curr.operands));
  return Ok{};
}